

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  Result RVar1;
  Enum EVar2;
  Index keep_count;
  Index drop_count;
  Location local_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  EVar2 = Error;
  RVar1 = GetReturnCallDropKeepCount
                    (this,(this->module_->func_types).
                          super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                          ._M_impl.super__Vector_impl_data._M_start + sig_index,1,&drop_count,
                     &keep_count);
  if (RVar1.enum_ != Error) {
    local_e8.field_1.field_0.line = 0;
    local_e8.field_1._4_8_ = 0;
    local_e8.filename.data_ = (char *)0x0;
    local_e8.filename.size_._0_4_ = 0;
    local_e8.filename.size_._4_4_ = 0;
    Var::Var(&local_78,sig_index,&local_e8);
    local_108.field_1.field_0.line = 0;
    local_108.field_1._4_8_ = 0;
    local_108.filename.data_ = (char *)0x0;
    local_108.filename.size_._0_4_ = 0;
    local_108.filename.size_._4_4_ = 0;
    Var::Var(&local_c0,table_index,&local_108);
    RVar1 = SharedValidator::OnReturnCallIndirect
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                       &local_78,&local_c0);
    Var::~Var(&local_c0);
    Var::~Var(&local_78);
    if (RVar1.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
      Istream::Emit(this->istream_,ReturnCallIndirect,table_index,sig_index);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallIndirectExpr(Index sig_index,
                                                    Index table_index) {
  FuncType& func_type = module_.func_types[sig_index];

  Index drop_count, keep_count;
  // +1 to include the index of the function.
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, +1, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // changes the type stack.
  CHECK_RESULT(
      validator_.OnReturnCallIndirect(loc, Var(sig_index), Var(table_index)));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::ReturnCallIndirect, table_index, sig_index);
  return Result::Ok;
}